

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int json_emit_va(char *s,int s_len,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  int *piVar5;
  double *pdVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  size_t __n;
  uint uVar11;
  char *pcVar12;
  void *__src;
  int iVar13;
  byte *buf;
  int iVar14;
  byte *pbVar15;
  int local_40;
  
  pbVar15 = (byte *)(s + s_len);
  buf = (byte *)s;
  do {
    lVar9 = 1;
    bVar1 = *fmt;
    uVar10 = bVar1 - 9;
    iVar14 = (int)pbVar15;
    iVar13 = (int)buf;
    if (uVar10 < 0x3e) {
      if ((0x2000800800013U >> ((ulong)uVar10 & 0x3f) & 1) != 0) goto switchD_001063ae_caseD_5b;
      if ((ulong)uVar10 != 0x3d) goto LAB_001063a0;
      uVar10 = iVar14 - iVar13;
      lVar9 = 5;
      if (0 < (int)uVar10) {
        sVar7 = 5;
        if (uVar10 < 5) {
          sVar7 = (size_t)uVar10;
        }
        memcpy(buf,"false",sVar7);
        lVar9 = 5;
        if (5 < uVar10) goto LAB_00106487;
      }
    }
    else {
LAB_001063a0:
      switch(bVar1) {
      case 0x53:
        uVar10 = ap->gp_offset;
        if ((ulong)uVar10 < 0x29) {
          puVar3 = (undefined8 *)((ulong)uVar10 + (long)ap->reg_save_area);
          ap->gp_offset = uVar10 + 8;
        }
        else {
          puVar3 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar3 + 1;
        }
        pcVar12 = (char *)*puVar3;
        uVar11 = iVar14 - iVar13;
        sVar7 = strlen(pcVar12);
        uVar10 = (uint)sVar7;
        if ((0 < (int)uVar11) && (0 < (int)uVar10)) {
          __n = (size_t)uVar11;
          if (uVar10 < uVar11) {
            __n = sVar7 & 0xffffffff;
          }
          memcpy(buf,pcVar12,__n);
          if (uVar10 < uVar11) {
            buf[__n] = 0;
          }
        }
        goto LAB_00106676;
      case 0x54:
        uVar10 = iVar14 - iVar13;
        lVar9 = 4;
        if (0 < (int)uVar10) {
          sVar7 = 4;
          if (uVar10 < 4) {
            sVar7 = (size_t)uVar10;
          }
          pcVar12 = "true";
LAB_0010646f:
          memcpy(buf,pcVar12,sVar7);
          lVar9 = 4;
          if (4 < uVar10) {
LAB_00106487:
            buf[sVar7] = 0;
          }
        }
        break;
      case 0x55:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5c:
        goto switchD_001063ae_caseD_55;
      case 0x56:
        uVar10 = ap->gp_offset;
        uVar8 = (ulong)uVar10;
        if (uVar8 < 0x29) {
          ap->gp_offset = (uint)(uVar8 + 8);
          __src = *(void **)((long)ap->reg_save_area + uVar8);
          if (0x20 < uVar10) goto LAB_00106537;
          puVar2 = (ulong *)(uVar8 + 8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar10 + 0x10;
        }
        else {
          puVar3 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar3 + 1;
          __src = (void *)*puVar3;
LAB_00106537:
          puVar2 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar2 + 1;
        }
        uVar11 = iVar14 - iVar13;
        uVar10 = (uint)*puVar2;
        if ((0 < (int)uVar11) && (0 < (int)uVar10)) {
          sVar7 = (size_t)uVar11;
          if (uVar10 < uVar11) {
            sVar7 = *puVar2 & 0xffffffff;
          }
          memcpy(buf,__src,sVar7);
          if (uVar10 < uVar11) {
            buf[sVar7] = 0;
          }
        }
        lVar9 = (long)(int)uVar10;
        break;
      case 0x5b:
      case 0x5d:
switchD_001063ae_caseD_5b:
        if (buf < pbVar15) {
          *buf = bVar1;
        }
        break;
      default:
        if (bVar1 == 0x4e) {
          uVar10 = iVar14 - iVar13;
          lVar9 = 4;
          if (0 < (int)uVar10) {
            sVar7 = 4;
            if (uVar10 < 4) {
              sVar7 = (size_t)uVar10;
            }
            pcVar12 = "null";
            goto LAB_0010646f;
          }
        }
        else {
          if (bVar1 == 0x66) {
            uVar10 = ap->fp_offset;
            if ((ulong)uVar10 < 0xa1) {
              pdVar6 = (double *)((ulong)uVar10 + (long)ap->reg_save_area);
              ap->fp_offset = uVar10 + 0x10;
            }
            else {
              pdVar6 = (double *)ap->overflow_arg_area;
              ap->overflow_arg_area = pdVar6 + 1;
            }
            uVar10 = json_emit_double((char *)buf,iVar14 - iVar13,*pdVar6);
          }
          else if (bVar1 == 0x69) {
            uVar10 = ap->gp_offset;
            if ((ulong)uVar10 < 0x29) {
              plVar4 = (long *)((ulong)uVar10 + (long)ap->reg_save_area);
              ap->gp_offset = uVar10 + 8;
            }
            else {
              plVar4 = (long *)ap->overflow_arg_area;
              ap->overflow_arg_area = plVar4 + 1;
            }
            uVar10 = json_emit_long((char *)buf,iVar14 - iVar13,*plVar4);
          }
          else if (bVar1 == 0x73) {
            uVar10 = ap->gp_offset;
            if ((ulong)uVar10 < 0x29) {
              puVar3 = (undefined8 *)((ulong)uVar10 + (long)ap->reg_save_area);
              ap->gp_offset = uVar10 + 8;
            }
            else {
              puVar3 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar3 + 1;
            }
            pcVar12 = (char *)*puVar3;
            sVar7 = strlen(pcVar12);
            uVar10 = json_emit_quoted_str((char *)buf,iVar14 - iVar13,pcVar12,(int)sVar7);
          }
          else {
            if (bVar1 != 0x76) {
              if ((bVar1 == 0x7b) || (bVar1 == 0x7d)) goto switchD_001063ae_caseD_5b;
              if (bVar1 == 0) {
                if (buf < pbVar15) {
                  *buf = 0;
                }
                local_40 = (int)s;
                iVar13 = iVar13 - local_40;
              }
              else {
switchD_001063ae_caseD_55:
                iVar13 = 0;
              }
              return iVar13;
            }
            uVar10 = ap->gp_offset;
            uVar8 = (ulong)uVar10;
            if (uVar8 < 0x29) {
              ap->gp_offset = (uint)(uVar8 + 8);
              pcVar12 = *(char **)((long)ap->reg_save_area + uVar8);
              if (0x20 < uVar10) goto LAB_00106637;
              piVar5 = (int *)(uVar8 + 8 + (long)ap->reg_save_area);
              ap->gp_offset = uVar10 + 0x10;
            }
            else {
              puVar3 = (undefined8 *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar3 + 1;
              pcVar12 = (char *)*puVar3;
LAB_00106637:
              piVar5 = (int *)ap->overflow_arg_area;
              ap->overflow_arg_area = piVar5 + 2;
            }
            uVar10 = json_emit_quoted_str((char *)buf,iVar14 - iVar13,pcVar12,*piVar5);
          }
LAB_00106676:
          lVar9 = (long)(int)uVar10;
        }
      }
    }
    buf = buf + lVar9;
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

int json_emit_va(char *s, int s_len, const char *fmt, va_list ap) {
    const char *end = s + s_len, *str, *orig = s;
    size_t len;

    while (*fmt != '\0') {
        switch (*fmt) {
            case '[':
            case ']':
            case '{':
            case '}':
            case ',':
            case ':':
            case ' ':
            case '\r':
            case '\n':
            case '\t':
                if (s < end) {
                    *s = *fmt;
                }
                s++;
                break;
            case 'i':
                s += json_emit_long(s, end - s, va_arg(ap, long));
                break;
            case 'f':
                s += json_emit_double(s, end - s, va_arg(ap, double));
                break;
            case 'v':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_quoted_str(s, end - s, str, len);
                break;
            case 'V':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_unquoted_str(s, end - s, str, len);
                break;
            case 's':
                str = va_arg(ap, char *);
                s += json_emit_quoted_str(s, end - s, str, strlen(str));
                break;
            case 'S':
                str = va_arg(ap, char *);
                s += json_emit_unquoted_str(s, end - s, str, strlen(str));
                break;
            case 'T':
                s += json_emit_unquoted_str(s, end - s, "true", 4);
                break;
            case 'F':
                s += json_emit_unquoted_str(s, end - s, "false", 5);
                break;
            case 'N':
                s += json_emit_unquoted_str(s, end - s, "null", 4);
                break;
            default:
                return 0;
        }
        fmt++;
    }

    /* Best-effort to 0-terminate generated string */
    if (s < end) {
        *s = '\0';
    }

    return s - orig;
}